

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O2

int __thiscall
FuzzingParameterSet::get_random_N_sided(FuzzingParameterSet *this,int upper_bound_max)

{
  int iVar1;
  Range<int> local_1c;
  
  if (upper_bound_max < (this->N_sided).max) {
    local_1c.min = (this->N_sided).min;
    local_1c.step = 1;
    local_1c.max = upper_bound_max;
    local_1c.dist._M_param._M_a = local_1c.min;
    local_1c.dist._M_param._M_b = upper_bound_max;
    iVar1 = Range<int>::get_random_number(&local_1c,&this->gen);
    return iVar1;
  }
  iVar1 = get_random_N_sided(this);
  return iVar1;
}

Assistant:

int FuzzingParameterSet::get_random_N_sided(int upper_bound_max) {
  if (N_sided.max > upper_bound_max) {
    return Range<int>(N_sided.min, upper_bound_max).get_random_number(gen);
  }
  return get_random_N_sided();
}